

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O2

bool Diligent::ValidateResourceViewDimension<Diligent::TextureViewVkImpl>
               (char *ResName,Uint32 ArraySize,Uint32 ArrayInd,TextureViewVkImpl *pViewImpl,
               RESOURCE_DIMENSION ExpectedResourceDim,bool IsMultisample)

{
  RESOURCE_DIMENSION TexType;
  Uint32 UVar1;
  Uint32 ArrayIndex;
  undefined7 in_register_00000081;
  String *Args_2;
  bool bVar2;
  string msg;
  String local_60;
  Char *local_40;
  Char *local_38;
  
  ArrayIndex = (Uint32)CONCAT71(in_register_00000081,ExpectedResourceDim);
  if (ArrayIndex == 0) {
    bVar2 = true;
  }
  else {
    TexType = GetResourceViewDimension((ITextureView *)pViewImpl);
    bVar2 = TexType == ExpectedResourceDim;
    if (!bVar2) {
      GetShaderResourcePrintName_abi_cxx11_
                (&local_60,(Diligent *)ResName,(char *)(ulong)ArraySize,ArrayInd,ArrayIndex);
      local_40 = GetResourceDimString(TexType);
      local_38 = GetResourceDimString(ExpectedResourceDim);
      Args_2 = &local_60;
      FormatString<char[33],char_const*,char[22],std::__cxx11::string,char[6],char_const*,char[52],char_const*,char[2]>
                (&msg,(Diligent *)"The dimension of resource view \'",
                 (char (*) [33])
                 &(pViewImpl->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                  .m_Desc,(char **)"\' bound to variable \'",(char (*) [22])Args_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\' is ",
                 (char (*) [6])&local_40,
                 (char **)", but resource dimension expected by the shader is ",
                 (char (*) [52])&local_38,(char **)0x665ed2,
                 (char (*) [2])CONCAT44(ArrayInd,ArraySize));
      ArrayIndex = (Uint32)Args_2;
      std::__cxx11::string::~string((string *)&local_60);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ValidateResourceViewDimension",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x177);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((TexType & ~RESOURCE_DIM_BUFFER) == RESOURCE_DIM_TEX_2D) {
      UVar1 = GetResourceSampleCount((ITextureView *)pViewImpl);
      if (IsMultisample && UVar1 == 1) {
        GetShaderResourcePrintName_abi_cxx11_
                  (&local_60,(Diligent *)ResName,(char *)(ulong)ArraySize,ArrayInd,ArrayIndex);
        FormatString<char[15],char_const*,char[22],std::__cxx11::string,char[47]>
                  (&msg,(Diligent *)"Texture view \'",
                   (char (*) [15])
                   &(pViewImpl->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                    .m_Desc,(char **)"\' bound to variable \'",(char (*) [22])&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\' is invalid: multisample texture is expected.",
                   (char (*) [47])CONCAT44(ArrayInd,ArraySize));
        std::__cxx11::string::~string((string *)&local_60);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"ValidateResourceViewDimension",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                   ,0x181);
      }
      else {
        if (UVar1 < 2 || IsMultisample) {
          return bVar2;
        }
        GetShaderResourcePrintName_abi_cxx11_
                  (&local_60,(Diligent *)ResName,(char *)(ulong)ArraySize,ArrayInd,ArrayIndex);
        FormatString<char[15],char_const*,char[22],std::__cxx11::string,char[49]>
                  (&msg,(Diligent *)"Texture view \'",
                   (char (*) [15])
                   &(pViewImpl->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                    .m_Desc,(char **)"\' bound to variable \'",(char (*) [22])&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\' is invalid: single-sample texture is expected.",
                   (char (*) [49])CONCAT44(ArrayInd,ArraySize));
        std::__cxx11::string::~string((string *)&local_60);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"ValidateResourceViewDimension",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                   ,0x187);
      }
      std::__cxx11::string::~string((string *)&msg);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ValidateResourceViewDimension(const char*                ResName,
                                   Uint32                     ArraySize,
                                   Uint32                     ArrayInd,
                                   const TextureViewImplType* pViewImpl,
                                   RESOURCE_DIMENSION         ExpectedResourceDim,
                                   bool                       IsMultisample)
{
    bool BindingsOK = true;

    if (ExpectedResourceDim != RESOURCE_DIM_UNDEFINED)
    {
        const RESOURCE_DIMENSION ResourceDim = GetResourceViewDimension(pViewImpl);
        if (ResourceDim != ExpectedResourceDim)
        {
            RESOURCE_VALIDATION_FAILURE("The dimension of resource view '", pViewImpl->GetDesc().Name,
                                        "' bound to variable '", GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is ", GetResourceDimString(ResourceDim),
                                        ", but resource dimension expected by the shader is ", GetResourceDimString(ExpectedResourceDim), ".");
            BindingsOK = false;
        }

        if (ResourceDim == RESOURCE_DIM_TEX_2D || ResourceDim == RESOURCE_DIM_TEX_2D_ARRAY)
        {
            Uint32 SampleCount = GetResourceSampleCount(pViewImpl);
            if (IsMultisample && SampleCount == 1)
            {
                RESOURCE_VALIDATION_FAILURE("Texture view '", pViewImpl->GetDesc().Name, "' bound to variable '",
                                            GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is invalid: multisample texture is expected.");
                BindingsOK = false;
            }
            else if (!IsMultisample && SampleCount > 1)
            {
                RESOURCE_VALIDATION_FAILURE("Texture view '", pViewImpl->GetDesc().Name, "' bound to variable '",
                                            GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is invalid: single-sample texture is expected.");
                BindingsOK = false;
            }
        }
    }

    return BindingsOK;
}